

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFPrimitiveWriter.cpp
# Opt level: O1

EStatusCode __thiscall
CFFPrimitiveWriter::WriteRealOperand(CFFPrimitiveWriter *this,double inValue,long inFractalLength)

{
  bool bVar1;
  double inIntegerValue;
  bool bVar2;
  byte bVar3;
  int iVar4;
  EStatusCode EVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  int iVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  long lVar10;
  ushort uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  double dVar14;
  byte local_66;
  bool local_65;
  undefined4 local_64;
  undefined1 local_60;
  byte local_5f;
  byte local_5e;
  byte local_5d;
  byte local_5c;
  byte local_5b;
  byte local_5a [2];
  double local_58;
  ulong uStack_50;
  undefined1 local_48 [16];
  double local_38;
  
  dVar14 = -inValue;
  uStack_50 = CONCAT44(in_XMM0_Dd,in_XMM0_Dc) ^ 0x8000000000000000;
  local_48._8_4_ = in_XMM0_Dc;
  local_48._0_8_ = inValue;
  local_48._12_4_ = in_XMM0_Dd;
  local_58 = dVar14;
  if (dVar14 <= inValue) {
    local_58 = inValue;
  }
  lVar10 = inFractalLength;
  inIntegerValue = floor(local_58);
  local_58 = local_58 - inIntegerValue;
  if ((local_58 != 0.0) || (NAN(local_58))) {
    uVar11 = 0;
    bVar2 = false;
    if ((inIntegerValue == 0.0) && ((!NAN(inIntegerValue) && (local_58 <= 0.001)))) {
      bVar2 = true;
      if (0.1 <= local_58) {
        local_64 = 0;
        goto LAB_00202307;
      }
      uVar11 = 0;
      do {
        uVar11 = uVar11 + 1;
        local_58 = local_58 * 10.0;
      } while (local_58 < 0.1);
    }
LAB_002022c0:
    local_64 = 0;
  }
  else {
    lVar7 = (long)inIntegerValue;
    bVar2 = false;
    uVar11 = 0;
    if ((inIntegerValue < 1000.0) || (uVar11 = 0, lVar7 != (lVar7 / 1000) * 1000))
    goto LAB_002022c0;
    uVar8 = lVar7 * -0x3333333333333333 + 0x1999999999999998;
    local_64 = (undefined4)CONCAT71((int7)((ulong)lVar10 >> 8),1);
    if ((uVar8 >> 1 | (ulong)((uVar8 & 1) != 0) << 0x3f) < 0x1999999999999999) {
      uVar11 = 0;
      do {
        uVar11 = uVar11 + 1;
        inIntegerValue = inIntegerValue / 10.0;
        uVar8 = (long)inIntegerValue * -0x3333333333333333 + 0x1999999999999998;
      } while ((uVar8 >> 1 | (ulong)((uVar8 & 1) != 0) << 0x3f) < 0x1999999999999999);
      bVar2 = false;
    }
    else {
      bVar2 = false;
LAB_00202307:
      uVar11 = 0;
    }
  }
  local_60 = 0x1e;
  iVar6 = -1;
  if (this->mInternalState != eFailure) {
    local_38 = inIntegerValue;
    iVar4 = (*this->mCFFOutput->_vptr_IByteWriter[2])(this->mCFFOutput,&local_60,1);
    iVar6 = -(uint)(CONCAT44(extraout_var,iVar4) != 1);
    if (CONCAT44(extraout_var,iVar4) != 1) {
      this->mInternalState = eFailure;
    }
    inIntegerValue = local_38;
  }
  if (iVar6 != 0) {
    return eFailure;
  }
  local_66 = (0.0 <= (double)local_48._0_8_) * ' ' - 0x20;
  local_65 = inValue < dVar14;
  if ((inIntegerValue != 0.0) || (NAN(inIntegerValue))) {
    EVar5 = WriteIntegerOfReal(this,inIntegerValue,&local_66,&local_65);
  }
  else {
    if (0.0 <= (double)local_48._0_8_) {
      local_66 = 0;
      local_65 = true;
      goto LAB_0020242e;
    }
    EVar5 = eFailure;
    local_5f = local_66;
    if (this->mInternalState != eFailure) {
      iVar6 = (*this->mCFFOutput->_vptr_IByteWriter[2])(this->mCFFOutput,&local_5f,1);
      EVar5 = -(uint)(CONCAT44(extraout_var_00,iVar6) != 1);
      if (CONCAT44(extraout_var_00,iVar6) != 1) {
        this->mInternalState = eFailure;
      }
    }
    local_66 = 0;
    local_65 = false;
  }
  if (EVar5 != eSuccess) {
    return eFailure;
  }
LAB_0020242e:
  bVar3 = local_66;
  bVar9 = local_65;
  if ((0 < inFractalLength) && ((local_58 != 0.0 || (NAN(local_58))))) {
    if (local_65 == true) {
      local_66 = local_66 | 10;
      iVar6 = -1;
      local_5e = local_66;
      if (this->mInternalState != eFailure) {
        iVar4 = (*this->mCFFOutput->_vptr_IByteWriter[2])(this->mCFFOutput,&local_5e,1);
        iVar6 = -(uint)(CONCAT44(extraout_var_01,iVar4) != 1);
        if (CONCAT44(extraout_var_01,iVar4) != 1) {
          this->mInternalState = eFailure;
        }
      }
      local_66 = 0;
      local_65 = false;
      if (iVar6 != 0) {
        return eFailure;
      }
    }
    else {
      local_66 = 0xa0;
      local_65 = true;
    }
    dVar14 = local_58;
    bVar3 = local_66;
    bVar9 = local_65;
    if ((local_58 != 0.0) || (NAN(local_58))) {
      do {
        local_58 = dVar14;
        dVar14 = floor(dVar14 * 10.0);
        uVar12 = SUB84(dVar14,0);
        uVar13 = (undefined4)((ulong)dVar14 >> 0x20);
        if (bVar9 == false) {
          bVar3 = (byte)(int)dVar14 << 4;
          bVar9 = true;
        }
        else {
          local_5d = bVar3 | (byte)(int)dVar14;
          if (this->mInternalState == eFailure) {
            iVar6 = -1;
          }
          else {
            local_48._0_8_ = dVar14;
            iVar4 = (*this->mCFFOutput->_vptr_IByteWriter[2])(this->mCFFOutput,&local_5d,1);
            iVar6 = -(uint)(CONCAT44(extraout_var_02,iVar4) != 1);
            if (CONCAT44(extraout_var_02,iVar4) != 1) {
              this->mInternalState = eFailure;
            }
            uVar12 = local_48._0_4_;
            uVar13 = local_48._4_4_;
          }
          if (iVar6 != 0) goto LAB_00202792;
          bVar3 = 0;
          bVar9 = false;
        }
        dVar14 = local_58 * 10.0 - (double)CONCAT44(uVar13,uVar12);
      } while (((dVar14 != 0.0) || (NAN(dVar14))) &&
              (bVar1 = 1 < inFractalLength, inFractalLength = inFractalLength + -1, bVar1));
    }
  }
  local_65 = bVar9;
  local_66 = bVar3;
  if (bVar2) {
    if (local_65 == true) {
      local_66 = local_66 | 0xc;
      iVar6 = -1;
      local_5c = local_66;
      if (this->mInternalState != eFailure) {
        iVar4 = (*this->mCFFOutput->_vptr_IByteWriter[2])(this->mCFFOutput,&local_5c,1);
        iVar6 = -(uint)(CONCAT44(extraout_var_03,iVar4) != 1);
        if (CONCAT44(extraout_var_03,iVar4) != 1) {
          this->mInternalState = eFailure;
        }
      }
      local_66 = 0;
      local_65 = false;
      if (iVar6 != 0) {
        return eFailure;
      }
    }
    else {
      local_66 = 0xc0;
      local_65 = true;
    }
    EVar5 = WriteIntegerOfReal(this,(double)uVar11,&local_66,&local_65);
    if (EVar5 != eSuccess) {
      return eFailure;
    }
  }
  if ((char)local_64 != '\0') {
    if (local_65 == true) {
      local_66 = local_66 | 0xb;
      iVar6 = -1;
      local_5b = local_66;
      if (this->mInternalState != eFailure) {
        iVar4 = (*this->mCFFOutput->_vptr_IByteWriter[2])(this->mCFFOutput,&local_5b,1);
        iVar6 = -(uint)(CONCAT44(extraout_var_04,iVar4) != 1);
        if (CONCAT44(extraout_var_04,iVar4) != 1) {
          this->mInternalState = eFailure;
        }
      }
      local_66 = 0;
      local_65 = false;
      if (iVar6 != 0) {
        return eFailure;
      }
    }
    else {
      local_66 = 0xb0;
      local_65 = true;
    }
    EVar5 = WriteIntegerOfReal(this,(double)uVar11,&local_66,&local_65);
    if (EVar5 != eSuccess) {
      return eFailure;
    }
  }
  if (local_65 == true) {
    local_66 = local_66 | 0xf;
    if (this->mInternalState == eFailure) {
      EVar5 = eFailure;
    }
    else {
      local_5a[0] = local_66;
      iVar6 = (*this->mCFFOutput->_vptr_IByteWriter[2])(this->mCFFOutput,local_5a,1);
      EVar5 = -(uint)(CONCAT44(extraout_var_05,iVar6) != 1);
      if (CONCAT44(extraout_var_05,iVar6) != 1) {
        this->mInternalState = eFailure;
      }
    }
  }
  else {
    local_5a[1] = 0xff;
    if (this->mInternalState == eFailure) {
LAB_00202792:
      EVar5 = eFailure;
    }
    else {
      iVar6 = (*this->mCFFOutput->_vptr_IByteWriter[2])(this->mCFFOutput,local_5a + 1,1);
      EVar5 = -(uint)(CONCAT44(extraout_var_06,iVar6) != 1);
      if (CONCAT44(extraout_var_06,iVar6) != 1) {
        this->mInternalState = eFailure;
      }
    }
  }
  return EVar5;
}

Assistant:

EStatusCode CFFPrimitiveWriter::WriteRealOperand(double inValue,long inFractalLength)
{
	// first, calculate the proper formatting
    
	bool minusSign = inValue < 0;
	bool minusExponent = false;
	bool plusExponent = false;
	unsigned short exponentSize = 0;
    
	if(minusSign)
		inValue = -inValue;
    
	double integerValue = floor(inValue);
	double fractalValue = inValue - integerValue;
    
	if(0 == fractalValue)
	{
		if(long(integerValue) % 1000 == 0 && integerValue >= 1000) // bother only if larger than 1000
		{
			plusExponent = true;
			while(long(integerValue) % 10 == 0)
			{
				++exponentSize;
				integerValue = integerValue / 10;
			}
		}
	}
    else if(0 == integerValue)
	{
		if(fractalValue <= 0.001) // bother only if < 0.001
		{
			minusExponent = true;
			while(fractalValue < 0.1)
			{
				++exponentSize;
				fractalValue = fractalValue * 10;
			}
		}
	}
    
	// now let's get to work
	if(WriteByte(30) != PDFHummus::eSuccess)
		return PDFHummus::eFailure;
    
	// first, take care of minus sign
	Byte buffer = minusSign ? 0xe0 : 0;
	bool usedFirst = minusSign;
    
	// Integer part
	if(integerValue != 0)
	{
	        if(WriteIntegerOfReal(integerValue,buffer,usedFirst) != PDFHummus::eSuccess)
			return PDFHummus::eFailure;
        }
	else
	{
		if(SetOrWriteNibble(0,buffer,usedFirst) != PDFHummus::eSuccess)
			return PDFHummus::eFailure;
	}

	// Fractal part (if there was an integer or not)
	if(fractalValue != 0 && inFractalLength > 0)
	{
		if(SetOrWriteNibble(0xa,buffer,usedFirst) != PDFHummus::eSuccess)
			return PDFHummus::eFailure;

		while(fractalValue != 0 && inFractalLength > 0)
		{
			if(SetOrWriteNibble((Byte)floor(fractalValue * 10),buffer,usedFirst) != PDFHummus::eSuccess)
				return PDFHummus::eFailure;
			fractalValue = fractalValue * 10 - floor(fractalValue * 10);
			--inFractalLength;
		}
	}
    
	// now, if there's any exponent, write it
	if(minusExponent)
	{
		if(SetOrWriteNibble(0xc,buffer,usedFirst) != PDFHummus::eSuccess)
			return PDFHummus::eFailure;
		if(WriteIntegerOfReal(exponentSize,buffer,usedFirst) != PDFHummus::eSuccess)
			return PDFHummus::eFailure;
	}
	if(plusExponent)
	{
		if(SetOrWriteNibble(0xb,buffer,usedFirst) != PDFHummus::eSuccess)
			return PDFHummus::eFailure;
		if(WriteIntegerOfReal(exponentSize,buffer,usedFirst) != PDFHummus::eSuccess)
			return PDFHummus::eFailure;
	}
    
	// final f or ff
	if(usedFirst)
		return SetOrWriteNibble(0xf,buffer,usedFirst);
	else
		return WriteByte(0xff);
    
}